

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void set_accepted_remote_ip(Curl_cfilter *cf,Curl_easy *data)

{
  uint uVar1;
  void *pvVar2;
  _Bool _Var3;
  int iVar4;
  uint *puVar5;
  char *pcVar6;
  int *piVar7;
  socklen_t local_1ac;
  int error;
  curl_socklen_t plen;
  Curl_sockaddr_storage ssrem;
  char buffer [256];
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar2 = cf->ctx;
  *(undefined1 *)((long)pvVar2 + 0xe0) = 0;
  *(undefined4 *)((long)pvVar2 + 0x110) = 0;
  local_1ac = 0x80;
  memset(&error,0,0x80);
  iVar4 = getpeername(*(int *)((long)pvVar2 + 0x98),(sockaddr *)&error,&local_1ac);
  if (iVar4 == 0) {
    _Var3 = Curl_addr2string((sockaddr *)&error,local_1ac,(char *)((long)pvVar2 + 0xe0),
                             (int *)((long)pvVar2 + 0x110));
    if (!_Var3) {
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      piVar7 = __errno_location();
      pcVar6 = Curl_strerror(*piVar7,(char *)&ssrem.buffer.sa_stor.__ss_align,0x100);
      Curl_failf(data,"ssrem inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar6);
    }
  }
  else {
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    pcVar6 = Curl_strerror(uVar1,(char *)&ssrem.buffer.sa_stor.__ss_align,0x100);
    Curl_failf(data,"getpeername() failed with errno %d: %s",(ulong)uVar1,pcVar6);
  }
  return;
}

Assistant:

static void set_accepted_remote_ip(struct Curl_cfilter *cf,
                                   struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
#ifdef HAVE_GETPEERNAME
  char buffer[STRERROR_LEN];
  struct Curl_sockaddr_storage ssrem;
  curl_socklen_t plen;

  ctx->r_ip[0] = 0;
  ctx->r_port = 0;
  plen = sizeof(ssrem);
  memset(&ssrem, 0, plen);
  if(getpeername(ctx->sock, (struct sockaddr*) &ssrem, &plen)) {
    int error = SOCKERRNO;
    failf(data, "getpeername() failed with errno %d: %s",
          error, Curl_strerror(error, buffer, sizeof(buffer)));
    return;
  }
  if(!Curl_addr2string((struct sockaddr*)&ssrem, plen,
                       ctx->r_ip, &ctx->r_port)) {
    failf(data, "ssrem inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    return;
  }
#else
  ctx->r_ip[0] = 0;
  ctx->r_port = 0;
  (void)data;
#endif
}